

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateResultExceptions_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  char *this_00;
  _Base_ptr p_Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string valueName;
  string templateString;
  allocator_type local_31a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_319;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_318;
  string *local_310;
  _Base_ptr local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  long *local_2b8;
  size_type local_2b0;
  long local_2a8 [2];
  long *local_298;
  size_type local_290;
  long local_288 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string local_238;
  string local_218;
  _Base_ptr local_1f8;
  VulkanHppGenerator *local_1f0;
  _Base_ptr local_1e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,
             "\n${enter}  class ${className} : public SystemError\n  {\n  public:\n    ${className}( std::string const & message )\n      : SystemError( make_error_code( ${enumName}::${enumMemberName} ), message ) {}\n    ${className}( char const * message )\n      : SystemError( make_error_code( ${enumName}::${enumMemberName} ), message ) {}\n  };\n${leave}"
             ,"");
  local_2c0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_2c0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  paVar7 = &local_1a0.first.field_2;
  local_310 = __return_storage_ptr__;
  local_1a0.first._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"VkResult","");
  local_308 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
              ::find(&(this->m_enums)._M_t,&local_1a0.first);
  local_1f0 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.first._M_dataplus._M_p != paVar7) {
    operator_delete(local_1a0.first._M_dataplus._M_p,
                    local_1a0.first.field_2._M_allocated_capacity + 1);
  }
  p_Var6 = local_308[5]._M_left;
  local_1e8 = local_308[5]._M_right;
  if (p_Var6 != local_1e8) {
    local_1f8 = local_308 + 1;
    local_318 = &local_a0;
    do {
      if ((char)p_Var6[4]._M_color == _S_black) {
        local_1a0.first._M_string_length = *(size_type *)(p_Var6 + 2);
        local_1a0.first._M_dataplus._M_p = (pointer)p_Var6[2]._M_parent;
        this_00 = "VK_ERROR";
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_1a0,"VK_ERROR"
                          );
        if (bVar2) {
          generateProtection(&local_1e0,(VulkanHppGenerator *)this_00,(string *)(p_Var6 + 3),true);
          generateEnumValueName
                    (&local_258,local_1f0,(string *)local_1f8,(string *)(p_Var6 + 2),false);
          local_298 = local_288;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"eError","");
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e0,local_258._M_dataplus._M_p,
                     local_258._M_dataplus._M_p + local_258._M_string_length);
          sVar1 = local_290;
          if ((local_290 <= local_2e0._M_string_length) &&
             ((local_290 == 0 ||
              (iVar3 = bcmp(local_2e0._M_dataplus._M_p,local_298,local_290), iVar3 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_2e0,0,sVar1);
          }
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_2e0,"Error");
          local_278._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
          paVar7 = &pbVar4->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p == paVar7) {
            local_278.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_278.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          }
          else {
            local_278.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          }
          local_278._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_1a0,(char (*) [10])"className",&local_278);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_160,(char (*) [6])"enter",&local_1e0.first);
          local_2b8 = local_2a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Vk","");
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_300,*(long *)(local_308 + 1),
                     (long)&(local_308[1]._M_parent)->_M_color + *(long *)(local_308 + 1));
          sVar1 = local_2b0;
          if ((local_2b0 <= local_300._M_string_length) &&
             ((local_2b0 == 0 ||
              (iVar3 = bcmp(local_300._M_dataplus._M_p,local_2b8,local_2b0), iVar3 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_300,0,sVar1);
          }
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_120,(char (*) [9])"enumName",&local_300);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_e0,(char (*) [15])"enumMemberName",&local_258);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_a0,(char (*) [6])"leave",&local_1e0.second);
          __l._M_len = 5;
          __l._M_array = &local_1a0;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_60,__l,&local_319,&local_31a);
          replaceWithMap(&local_238,&local_218,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_60);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (local_310,local_238._M_dataplus._M_p,local_238._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_60);
          lVar5 = -0x140;
          paVar7 = &local_a0.second.field_2;
          do {
            if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&paVar7->_M_allocated_capacity)[-2]) {
              operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],
                              paVar7->_M_allocated_capacity + 1);
            }
            if (&paVar7->_M_allocated_capacity + -4 !=
                (size_type *)(&paVar7->_M_allocated_capacity)[-6]) {
              operator_delete((size_type *)(&paVar7->_M_allocated_capacity)[-6],
                              (&paVar7->_M_allocated_capacity)[-4] + 1);
            }
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(&paVar7->_M_allocated_capacity + -8);
            lVar5 = lVar5 + 0x40;
          } while (lVar5 != 0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
          }
          if (local_2b8 != local_2a8) {
            operator_delete(local_2b8,local_2a8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          if (local_298 != local_288) {
            operator_delete(local_298,local_288[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0.second._M_dataplus._M_p != &local_1e0.second.field_2) {
            operator_delete(local_1e0.second._M_dataplus._M_p,
                            local_1e0.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0.first._M_dataplus._M_p != &local_1e0.first.field_2) {
            operator_delete(local_1e0.first._M_dataplus._M_p,
                            local_1e0.first.field_2._M_allocated_capacity + 1);
          }
        }
      }
      p_Var6 = (_Base_ptr)&p_Var6[5]._M_left;
    } while (p_Var6 != local_1e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  return local_310;
}

Assistant:

std::string VulkanHppGenerator::generateResultExceptions() const
{
  const std::string templateString = R"(
${enter}  class ${className} : public SystemError
  {
  public:
    ${className}( std::string const & message )
      : SystemError( make_error_code( ${enumName}::${enumMemberName} ), message ) {}
    ${className}( char const * message )
      : SystemError( make_error_code( ${enumName}::${enumMemberName} ), message ) {}
  };
${leave})";

  std::string str;
  auto        enumIt = m_enums.find( "VkResult" );
  for ( auto const & value : enumIt->second.values )
  {
    if ( value.supported && value.name.starts_with( "VK_ERROR" ) )
    {
      auto [enter, leave]   = generateProtection( value.protect );
      std::string valueName = generateEnumValueName( enumIt->first, value.name, false );
      str += replaceWithMap( templateString,
                             { { "className", stripPrefix( valueName, "eError" ) + "Error" },
                               { "enter", enter },
                               { "enumName", stripPrefix( enumIt->first, "Vk" ) },
                               { "enumMemberName", valueName },
                               { "leave", leave } } );
    }
  }
  return str;
}